

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

IceTBoolean icetMatrixInverse(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double local_118 [32];
  
  pdVar2 = local_118;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)pdVar2 + lVar11) = *(undefined8 *)((long)matrix_in + lVar11 * 4);
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x20);
    local_118[lVar3 * 8 + 6] = 0.0;
    local_118[lVar3 * 8 + 7] = 0.0;
    local_118[lVar3 * 8 + 4] = 0.0;
    local_118[lVar3 * 8 + 5] = 0.0;
    local_118[lVar3 * 9 + 4] = 1.0;
    lVar3 = lVar3 + 1;
    matrix_in = matrix_in + 1;
    pdVar2 = pdVar2 + 8;
  } while (lVar3 != 4);
  lVar3 = -3;
  pdVar2 = local_118;
  pdVar4 = local_118 + 8;
  pdVar7 = pdVar2;
  pdVar8 = pdVar2;
  uVar9 = 0;
  do {
    uVar10 = (uint)uVar9;
    if (uVar9 < 3) {
      uVar12 = uVar9 & 0xffffffff;
      pdVar5 = pdVar4;
      lVar11 = lVar3;
      do {
        if (ABS(local_118[(long)(int)uVar12 * 8 + uVar9]) < ABS(*pdVar5)) {
          uVar12 = (ulong)((int)lVar11 + 4);
        }
        uVar10 = (uint)uVar12;
        pdVar5 = pdVar5 + 8;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
    }
    if ((local_118[(long)(int)uVar10 * 8 + uVar9] == 0.0) &&
       (!NAN(local_118[(long)(int)uVar10 * 8 + uVar9]))) {
      return '\0';
    }
    if (uVar9 != uVar10) {
      lVar11 = 0;
      do {
        dVar1 = pdVar8[lVar11];
        pdVar8[lVar11] = local_118[(long)(int)uVar10 * 8 + lVar11];
        local_118[(long)(int)uVar10 * 8 + lVar11] = dVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
    }
    uVar12 = uVar9 + 1;
    dVar1 = local_118[uVar9 * 9];
    lVar11 = -8;
    do {
      pdVar7[lVar11 + 8] = pdVar7[lVar11 + 8] * (1.0 / dVar1);
      lVar11 = lVar11 + 1;
    } while (uVar9 + lVar11 != 0);
    uVar6 = 0;
    pdVar5 = pdVar2;
    do {
      if (uVar6 != uVar9) {
        dVar1 = local_118[uVar6 * 8 + uVar9];
        lVar11 = -8;
        do {
          pdVar5[lVar11 + 8] = pdVar7[lVar11 + 8] * -dVar1 + pdVar5[lVar11 + 8];
          lVar11 = lVar11 + 1;
        } while (uVar9 + lVar11 != 0);
      }
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 8;
    } while (uVar6 != 4);
    pdVar4 = pdVar4 + 9;
    lVar3 = lVar3 + 1;
    pdVar8 = pdVar8 + 8;
    pdVar7 = pdVar7 + 9;
    pdVar2 = pdVar2 + 1;
    uVar9 = uVar12;
  } while (uVar12 != 4);
  pdVar2 = local_118 + 4;
  lVar3 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)matrix_out + lVar11 * 4) = *(undefined8 *)((long)pdVar2 + lVar11);
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x20);
    lVar3 = lVar3 + 1;
    matrix_out = matrix_out + 1;
    pdVar2 = pdVar2 + 8;
  } while (lVar3 != 4);
  return '\x01';
}

Assistant:

IceTBoolean icetMatrixInverse(const IceTDouble *matrix_in,
                              IceTDouble *matrix_out)
{
    /* A 4x8 matrix we will do operations on.  The matrix starts as matrix_in
     * adjoined with the identity matrix.  We then do Gaussian elimination and
     * back substitution on the matrix that will result with the identity matrix
     * adjoined with the inverse of the original matrix. */
    IceTDouble matrix[4][8];
    int eliminationIdx;
    int rowIdx;

    /* Initialize the matrix. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        /* Left half is equal to matrix_in. */
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            matrix[rowIdx][columnIdx] = MAT(matrix_in, rowIdx, columnIdx);
        }
        /* Right half is the identity matrix. */
        for (columnIdx = 4; columnIdx < 8; columnIdx++) {
            matrix[rowIdx][columnIdx] = 0.0;
        }
        matrix[rowIdx][rowIdx+4] = 1.0;
    }

    /* Per the Gaussian elimination algorithm, starting at the top row make
     * the leftmost value 1 and zero out the column on all lower rows.  Repeat
     * to rows on down.  If a column will all remaining zeros is encountered,
     * no inverse exists so return failure. */
    for (eliminationIdx = 0; eliminationIdx < 4; eliminationIdx++)
    {
        int pivotIdx;
        int columnIdx;
        IceTDouble scale_value;

        /* Choose the pivot row as the one with the highest absolute value in
         * the elimination column. */
        pivotIdx = eliminationIdx;
        for (rowIdx = eliminationIdx+1; rowIdx < 4; rowIdx++) {
            if (  fabs(matrix[pivotIdx][eliminationIdx])
                < fabs(matrix[rowIdx][eliminationIdx]) ) {
                pivotIdx = rowIdx;
            }
        }

        /* If the entry in pivotIdx is 0, then all the values in the column must
         * be zero and no inverse exists. */
        if (matrix[pivotIdx][eliminationIdx] == 0.0) return ICET_FALSE;

        /* Swap the elimination row with the pivot row to make the pivot row the
         * elimination row. */
        if (pivotIdx != eliminationIdx) {
            for (columnIdx = 0; columnIdx < 8; columnIdx++) {
                IceTDouble old_elim_value = matrix[eliminationIdx][columnIdx];
                matrix[eliminationIdx][columnIdx] = matrix[pivotIdx][columnIdx];
                matrix[pivotIdx][columnIdx] = old_elim_value;
            }
        }

        /* Size the elimination row to scale the eliminationIdx column to 1. */
        scale_value = 1.0/matrix[eliminationIdx][eliminationIdx];
        for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
            matrix[eliminationIdx][columnIdx] *= scale_value;
        }

        /* Add a multiple of the elimination row to all other rows to zero out
         * that column of values.  Note that this is also doing back-propagation
         * as it is zeroing out values above. */
        for (rowIdx = 0; rowIdx < 4; rowIdx++) {
            if (rowIdx == eliminationIdx) continue;
            scale_value = -matrix[rowIdx][eliminationIdx];
            for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
                matrix[rowIdx][columnIdx]
                    += scale_value*matrix[eliminationIdx][columnIdx];
            }
        }
    }

    /* At this point, the left 4x4 submatrix of matrix should be the identity
     * matrix and the right 4x4 submatrix is the inverse of matrix_in.  Copy the
     * result to matrix_out. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            MAT(matrix_out, rowIdx, columnIdx) = matrix[rowIdx][columnIdx+4];
        }
    }

    return ICET_TRUE;
}